

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O2

int cipher_get_ctx_params(void *vgctx,OSSL_PARAM *params)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ASN1_TYPE *type;
  undefined8 uVar4;
  uint uVar5;
  uchar *der;
  size_t taglen;
  
  iVar1 = cipher_get_params(*(EVP_CIPHER **)((long)vgctx + 0x18),params);
  uVar5 = 0;
  if (iVar1 != 0) {
    lVar3 = OSSL_PARAM_locate(params,"alg_id_param");
    if (lVar3 == 0) {
      lVar3 = OSSL_PARAM_locate(params,"updated-iv");
      if (lVar3 != 0) {
        uVar4 = EVP_CIPHER_CTX_iv(*(undefined8 *)((long)vgctx + 0x20));
        iVar1 = EVP_CIPHER_CTX_get_iv_length(*(undefined8 *)((long)vgctx + 0x20));
        iVar2 = OSSL_PARAM_set_octet_ptr(lVar3,uVar4,(long)iVar1);
        if ((iVar2 == 0) &&
           (iVar1 = OSSL_PARAM_set_octet_string(lVar3,uVar4,(long)iVar1), iVar1 == 0)) {
          return 0;
        }
      }
      lVar3 = OSSL_PARAM_locate(params,"tag");
      if (lVar3 != 0) {
        der = (uchar *)0x0;
        taglen = 0;
        iVar1 = OSSL_PARAM_get_octet_string_ptr(lVar3);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),0x10,(int)taglen,der);
        if (iVar1 < 1) {
          return 0;
        }
      }
      uVar5 = 1;
    }
    else {
      der = (uchar *)0x0;
      type = ASN1_TYPE_new();
      uVar5 = 0;
      if (((type != (ASN1_TYPE *)0x0) &&
          (iVar1 = EVP_CIPHER_param_to_asn1(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),type),
          0 < iVar1)) && (iVar1 = i2d_ASN1_TYPE(type,&der), -1 < iVar1)) {
        iVar1 = OSSL_PARAM_set_octet_string(lVar3,&der,iVar1);
        uVar5 = (uint)(iVar1 != 0);
      }
      CRYPTO_free(der);
      ASN1_TYPE_free(type);
    }
  }
  return uVar5;
}

Assistant:

static int cipher_get_ctx_params(void *vgctx, OSSL_PARAM params[])
{
    GOST_CTX *gctx = vgctx;
    OSSL_PARAM *p;

    if (!cipher_get_params(gctx->cipher, params))
        return 0;
    if ((p = OSSL_PARAM_locate(params, "alg_id_param")) != NULL) {
        ASN1_TYPE *algidparam = NULL;
        unsigned char *der = NULL;
        int derlen = 0;
        int ret;

        ret = (algidparam = ASN1_TYPE_new()) != NULL
            && EVP_CIPHER_param_to_asn1(gctx->cctx, algidparam) > 0
            && (derlen = i2d_ASN1_TYPE(algidparam, &der)) >= 0
            && OSSL_PARAM_set_octet_string(p, &der, (size_t)derlen);

        OPENSSL_free(der);
        ASN1_TYPE_free(algidparam);
        return ret;
    }
    if ((p = OSSL_PARAM_locate(params, "updated-iv")) != NULL) {
        const void *iv = EVP_CIPHER_CTX_iv(gctx->cctx);
        size_t ivlen = EVP_CIPHER_CTX_iv_length(gctx->cctx);

        if (!OSSL_PARAM_set_octet_ptr(p, iv, ivlen)
            && !OSSL_PARAM_set_octet_string(p, iv, ivlen))
            return 0;
    }
    if ((p = OSSL_PARAM_locate(params, OSSL_CIPHER_PARAM_AEAD_TAG)) != NULL) {
        void *tag = NULL;
        size_t taglen = 0;

        if (!OSSL_PARAM_get_octet_string_ptr(p, (const void**)&tag, &taglen)
            || EVP_CIPHER_CTX_ctrl(gctx->cctx, EVP_CTRL_AEAD_GET_TAG,
                                   taglen, tag) <= 0)
            return 0;
    }
    return 1;
}